

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmString.hxx
# Opt level: O0

String * cm::operator+=(String *s,
                       StringOpPlus<const_cm::StringOpPlus<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_&,_std::basic_string_view<char,_std::char_traits<char>_>_>
                       *a)

{
  char *pcVar1;
  undefined1 local_38 [8];
  string r;
  StringOpPlus<const_cm::StringOpPlus<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_&,_std::basic_string_view<char,_std::char_traits<char>_>_>
  *a_local;
  String *s_local;
  
  r.field_2._8_8_ = a;
  std::__cxx11::string::string((string *)local_38);
  String::size(s);
  StringOpPlus<const_cm::StringOpPlus<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_&,_std::basic_string_view<char,_std::char_traits<char>_>_>
  ::size((StringOpPlus<const_cm::StringOpPlus<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_&,_std::basic_string_view<char,_std::char_traits<char>_>_>
          *)r.field_2._8_8_);
  std::__cxx11::string::reserve((ulong)local_38);
  pcVar1 = String::data(s);
  String::size(s);
  std::__cxx11::string::assign(local_38,(ulong)pcVar1);
  operator+=((string *)local_38,
             *(StringOpPlus<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
               **)r.field_2._8_8_);
  std::__cxx11::string::operator+=
            ((string *)local_38,
             (basic_string_view<char,_std::char_traits<char>_> *)(r.field_2._8_8_ + 8));
  String::operator=(s,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38)
  ;
  std::__cxx11::string::~string((string *)local_38);
  return s;
}

Assistant:

String& operator+=(String& s, StringOpPlus<L, R> const& a)
{
  std::string r;
  r.reserve(s.size() + a.size());
  r.assign(s.data(), s.size());
  r += a.l;
  r += a.r;
  s = std::move(r);
  return s;
}